

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

int ravi_resize_array(lua_State *L,RaviArray *t,uint new_size,int initialize)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  
  bVar2 = t->flags;
  iVar4 = 0;
  if ((bVar2 & 3) == 0) {
    uVar3 = t->size;
    uVar1 = (ulong)uVar3 + 10;
    uVar6 = (uint)uVar1;
    if (uVar1 <= new_size) {
      uVar6 = new_size;
    }
    if (0xfffffff5 < uVar3) {
      uVar6 = new_size;
    }
    iVar4 = 0;
    if (uVar3 < uVar6) {
      if (uVar3 != 3 && (char)((bVar2 & 4) >> 2) == '\0') {
        __assert_fail("!was_allocated ? t->size == RAVI_ARRAY_MAX_INLINE : 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x341,"int ravi_resize_array(lua_State *, RaviArray *, unsigned int, int)");
      }
      pcVar5 = t->data;
      if ((bVar2 & 4) == 0) {
        if ((anon_union_24_3_4803335f_for_RaviArray_6 *)pcVar5 != &t->field_6) {
          __assert_fail("!was_allocated ? (t->data == (char*)&t->numarray || t->data == (char*)&t->intarray) : 1"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                        ,0x342,"int ravi_resize_array(lua_State *, RaviArray *, unsigned int, int)")
          ;
        }
        pcVar5 = (char *)0x0;
      }
      pcVar5 = (char *)luaM_realloc_(L,pcVar5,(ulong)uVar3 << 3,(ulong)uVar6 << 3);
      t->data = pcVar5;
      if ((bVar2 & 4) == 0) {
        memcpy(pcVar5,&t->field_6,(ulong)t->size << 3);
      }
      if (initialize != 0) {
        memset(t->data + (ulong)t->len * 8,0,(ulong)(uVar6 - t->size) << 3);
      }
      t->size = uVar6;
      t->flags = t->flags | 4;
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int ravi_resize_array(lua_State *L, RaviArray *t, unsigned int new_size, int initialize) {
  if (t->flags & RAVI_ARRAY_FIXEDSIZE || t->flags & RAVI_ARRAY_SLICE) {
    /* cannot resize */
    return 0;
  }
  /* make sure new size is not going to overflow */
  unsigned int size;
  uint64_t next_size = (uint64_t)t->size + 10;
  if (new_size < next_size) {
    size = (unsigned int)next_size;
    if (size != next_size)
      // overflow
      size = new_size;
  }
  else {
    size = new_size;
  }
  if (size <= t->size) {
    // overflow
    return 0;
  }
  /*
  Array could initially be pointing to inline storage so we
  need to be careful when reallocating. Also we allow for lua_Number and
  lua_Integer to be different sizes
  */
  int number_array = t->flags & RAVI_ARRAY_ISFLOAT;
  int was_allocated = t->flags & RAVI_ARRAY_ALLOCATED;
  lua_assert(!was_allocated ? t->size == RAVI_ARRAY_MAX_INLINE : 1);
  lua_assert(!was_allocated ? (t->data == (char*)&t->numarray || t->data == (char*)&t->intarray) : 1);
  char *olddata = was_allocated ? t->data : NULL;  // Not allocated
  if (number_array) {
    t->data = (char *)luaM_reallocv(L, olddata, t->size, size, sizeof(lua_Number));
    if (!was_allocated)
      memcpy(t->data, t->numarray, sizeof(lua_Number) * t->size);
    if (initialize) {
      lua_Number *ndata = (lua_Number *)t->data;
      memset(&ndata[t->len], 0, (size - t->size) * sizeof(lua_Number));
    }
  }
  else {
    t->data = (char *)luaM_reallocv(L, olddata, t->size, size, sizeof(lua_Integer));
    if (!was_allocated)
      memcpy(t->data, t->intarray, sizeof(lua_Integer) * t->size);
    if (initialize) {
      lua_Integer *idata = (lua_Integer *)t->data;
      memset(&idata[t->len], 0, (size - t->size) * sizeof(lua_Integer));
    }
  }
  t->size = size;
  t->flags |= RAVI_ARRAY_ALLOCATED;
  return 1;
}